

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int google::SafeFOpen(FILE **fp,char *fname,char *mode)

{
  FILE *pFVar1;
  int *piVar2;
  int local_24;
  char *mode_local;
  char *fname_local;
  FILE **fp_local;
  
  if (fp != (FILE **)0x0) {
    pFVar1 = fopen(fname,mode);
    *fp = (FILE *)pFVar1;
    if (*fp == (FILE *)0x0) {
      piVar2 = __errno_location();
      local_24 = *piVar2;
    }
    else {
      local_24 = 0;
    }
    return local_24;
  }
  __assert_fail("fp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/util.h"
                ,0x16a,"int google::SafeFOpen(FILE **, const char *, const char *)");
}

Assistant:

inline int SafeFOpen(FILE **fp, const char* fname, const char *mode)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
	return fopen_s(fp, fname, mode);
#else
	assert(fp != NULL);
	*fp = fopen(fname, mode);
    // errno only guaranteed to be set on failure
	return ((*fp == NULL) ? errno : 0);
#endif
}